

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_set_ctl_filename(char *ctl_filename)

{
  lineiter_t *li;
  uint32 *in_RCX;
  uint32 *sf;
  char *path;
  char **in_R8;
  
  path = "rb";
  ctl_fp = (FILE *)fopen(ctl_filename,"rb");
  if ((FILE *)ctl_fp == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x13c,"Unable to open %s for reading",ctl_filename);
  }
  else {
    li = lineiter_start_clean(ctl_fp);
    if (li != (lineiter_t *)0x0) {
      parse_ctl_line(li->buf,(char **)path,sf,in_RCX,in_R8);
      lineiter_free(li);
      return 0;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x143,"Must be at least one line in the control file\n");
  }
  return -1;
}

Assistant:

int
corpus_set_ctl_filename(const char *ctl_filename)
{
    lineiter_t *li;
    ctl_fp = fopen(ctl_filename, "rb");

    if (ctl_fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for reading",  ctl_filename);
	return S3_ERROR;
    }
    
    li = lineiter_start_clean(ctl_fp);

    if (li == NULL) {
	E_ERROR("Must be at least one line in the control file\n");
	return S3_ERROR;
    }

    parse_ctl_line(li->buf,
		   &next_ctl_path,
		   &next_ctl_sf,
		   &next_ctl_ef,
		   &next_ctl_utt_id);
    lineiter_free (li);
    
    return S3_SUCCESS;
}